

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O0

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  long *in_RCX;
  long *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  Object obj;
  float y1;
  float x1;
  float y0;
  float x0;
  float pb_h;
  float pb_w;
  float pb_cy;
  float pb_cx;
  float dh;
  float dw;
  float dy;
  float dx;
  float confidence;
  float box_score;
  float score;
  int k;
  float class_score;
  int class_index;
  int j;
  int i;
  float anchor_h;
  float anchor_w;
  int q;
  int feat_offset;
  int num_class;
  int num_anchors;
  int num_grid_y;
  int num_grid_x;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  value_type *in_stack_fffffffffffff748;
  vector<Object,_std::allocator<Object>_> *in_stack_fffffffffffff750;
  void *local_748;
  int *local_740;
  ulong local_738;
  undefined4 local_730;
  long *local_728;
  int local_720;
  int local_71c;
  int local_718;
  undefined4 local_714;
  undefined4 local_710;
  ulong local_708;
  float local_6fc;
  void *local_6f8;
  int *local_6f0;
  ulong local_6e8;
  undefined4 local_6e0;
  long *local_6d8;
  int local_6d0;
  int local_6cc;
  int local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  ulong local_6b8;
  float local_6ac;
  void *local_6a8;
  int *local_6a0;
  ulong local_698;
  undefined4 local_690;
  long *local_688;
  int local_680;
  int local_67c;
  int local_678;
  undefined4 local_674;
  undefined4 local_670;
  ulong local_668;
  float local_65c;
  void *local_658;
  int *local_650;
  ulong local_648;
  undefined4 local_640;
  long *local_638;
  int local_630;
  int local_62c;
  int local_628;
  undefined4 local_624;
  undefined4 local_620;
  ulong local_618;
  float local_610;
  float local_60c;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined4 local_5f0;
  long local_5e8;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined8 local_5c8;
  undefined4 local_5c0;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined4 local_598;
  long local_590;
  undefined4 local_588;
  undefined4 local_584;
  undefined4 local_580;
  undefined4 local_57c;
  undefined4 local_578;
  undefined8 local_570;
  float local_568;
  int local_564;
  float local_560;
  int local_55c;
  int local_558;
  int local_554;
  undefined4 local_550;
  undefined4 local_54c;
  int local_548;
  int local_544;
  int local_540;
  int local_53c;
  int local_538;
  int local_534;
  float local_524;
  long *local_520;
  long *local_508;
  undefined8 *local_500;
  undefined8 *local_4f0;
  void **local_4e0;
  void **local_4d0;
  void **local_4c0;
  void **local_4b0;
  long local_4a0;
  long *local_498;
  long local_490;
  long *local_488;
  undefined1 local_47d;
  int local_47c;
  void **local_470;
  undefined1 local_45d;
  int local_45c;
  void **local_450;
  undefined1 local_43d;
  int local_43c;
  void **local_430;
  undefined1 local_41d;
  int local_41c;
  void **local_410;
  undefined1 local_3fd;
  int local_3fc;
  undefined8 *local_3f0;
  undefined1 local_3dd;
  int local_3dc;
  undefined8 *local_3d0;
  int local_3bc;
  void **local_3b8;
  int local_3ac;
  void **local_3a8;
  int local_39c;
  void **local_398;
  int local_38c;
  void **local_388;
  int local_37c;
  undefined8 *local_378;
  int local_36c;
  undefined8 *local_368;
  long local_360;
  undefined4 local_354;
  long local_350;
  long local_348;
  undefined4 local_33c;
  int local_338;
  int local_334;
  undefined8 *local_330;
  long local_328;
  undefined4 local_31c;
  long local_318;
  long local_310;
  undefined4 local_304;
  int local_300;
  int local_2fc;
  undefined8 *local_2f8;
  long *local_2f0;
  undefined4 local_2e4;
  ulong local_2e0;
  void *local_2d8;
  undefined4 local_2cc;
  int local_2c8;
  int local_2c4;
  void **local_2c0;
  long *local_2b8;
  undefined4 local_2ac;
  ulong local_2a8;
  void *local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  void **local_288;
  long *local_280;
  undefined4 local_274;
  ulong local_270;
  void *local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  void **local_250;
  long *local_248;
  undefined4 local_23c;
  ulong local_238;
  void *local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  void **local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  undefined8 *local_b8;
  undefined8 *local_98;
  void *local_70;
  void *local_60;
  void *local_50;
  void *local_40;
  
  local_534 = *(int *)((long)in_RCX + 0x2c);
  local_538 = (int)in_RCX[6];
  local_53c = *(int *)((long)in_RDI + 0x2c) / 2;
  local_544 = (int)in_RCX[7] / local_53c;
  local_540 = local_544 + -5;
  local_524 = in_XMM0_Da;
  local_520 = in_RCX;
  local_508 = in_RDI;
  for (local_548 = 0; local_548 < local_53c; local_548 = local_548 + 1) {
    local_490 = (long)(local_548 << 1);
    local_488 = local_508;
    local_54c = *(undefined4 *)(*local_508 + local_490 * 4);
    local_4a0 = (long)(local_548 * 2 + 1);
    local_498 = local_508;
    local_550 = *(undefined4 *)(*local_508 + local_4a0 * 4);
    for (local_554 = 0; local_554 < local_538; local_554 = local_554 + 1) {
      for (local_558 = 0; local_558 < local_534; local_558 = local_558 + 1) {
        local_55c = 0;
        local_560 = -3.4028235e+38;
        for (local_564 = 0; local_564 < local_540; local_564 = local_564 + 1) {
          local_3dc = local_548 * local_544 + 5 + local_564;
          local_3d0 = &local_5b0;
          local_334 = *(int *)((long)local_520 + 0x2c);
          local_338 = (int)local_520[6];
          local_33c = *(undefined4 *)((long)local_520 + 0x34);
          local_348 = *local_520 + local_520[8] * (long)local_3dc * local_520[2];
          local_350 = local_520[2];
          local_354 = (undefined4)local_520[3];
          local_360 = local_520[4];
          local_330 = &local_5b0;
          local_1b8 = (long)local_334 * (long)local_338 * local_350;
          local_1bc = 0x10;
          local_3dd = 1;
          local_368 = &local_5b0;
          local_36c = local_554;
          local_568 = *(float *)(local_348 + (long)local_334 * (long)local_554 * local_350 +
                                (long)local_558 * 4);
          local_500 = &local_5b0;
          local_5b0 = 0;
          local_5a0 = 0;
          local_598 = 0;
          local_588 = 0;
          local_584 = 0;
          local_580 = 0;
          local_57c = 0;
          local_578 = 0;
          local_570 = 0;
          local_5a8 = 0;
          if (local_560 < local_568) {
            local_55c = local_564;
            local_560 = local_568;
          }
          local_98 = local_500;
          local_590 = local_360;
        }
        local_3fc = local_548 * local_544 + 4;
        local_3f0 = &local_608;
        local_2fc = *(int *)((long)local_520 + 0x2c);
        local_300 = (int)local_520[6];
        local_304 = *(undefined4 *)((long)local_520 + 0x34);
        local_310 = *local_520 + local_520[8] * (long)local_3fc * local_520[2];
        local_318 = local_520[2];
        local_31c = (undefined4)local_520[3];
        local_328 = local_520[4];
        local_2f8 = &local_608;
        local_1c8 = (long)local_2fc * (long)local_300 * local_318;
        local_378 = &local_608;
        local_5c0 = *(undefined4 *)
                     (local_310 + (long)local_2fc * (long)local_554 * local_318 +
                     (long)local_558 * 4);
        local_4f0 = &local_608;
        local_1cc = 0x10;
        local_37c = local_554;
        local_3fd = 1;
        local_608 = 0;
        local_5f8 = 0;
        local_5f0 = 0;
        local_5e0 = 0;
        local_5dc = 0;
        local_5d8 = 0;
        local_5d4 = 0;
        local_5d0 = 0;
        local_5c8 = 0;
        local_600 = 0;
        local_b8 = local_4f0;
        local_5e8 = local_328;
        fVar1 = sigmoid(0.0);
        local_60c = sigmoid(0.0);
        local_60c = fVar1 * local_60c;
        if (local_524 <= local_60c) {
          local_41c = local_548 * local_544;
          local_410 = &local_658;
          local_2c4 = *(int *)((long)local_520 + 0x2c);
          local_2c8 = (int)local_520[6];
          local_2cc = *(undefined4 *)((long)local_520 + 0x34);
          local_2d8 = (void *)(*local_520 + local_520[8] * (long)local_41c * local_520[2]);
          local_2e0 = local_520[2];
          local_2e4 = (undefined4)local_520[3];
          local_2f0 = (long *)local_520[4];
          local_2c0 = &local_658;
          local_650 = (int *)0x0;
          local_624 = 1;
          local_1d8 = (long)local_2c4 * (long)local_2c8 * local_2e0;
          local_618 = (local_1d8 + 0xfU & 0xfffffffffffffff0) / local_2e0;
          local_630 = (int)local_520[5] + -1;
          if ((int)local_520[5] == 4) {
            local_618 = (long)*(int *)((long)local_520 + 0x2c) * (long)(int)local_520[6];
          }
          local_1dc = 0x10;
          local_41d = 1;
          local_388 = &local_658;
          local_38c = local_554;
          local_658 = local_2d8;
          local_648 = local_2e0;
          local_640 = local_2e4;
          local_638 = local_2f0;
          local_62c = local_2c4;
          local_628 = local_2c8;
          local_620 = local_2cc;
          fVar1 = sigmoid(0.0);
          local_4e0 = &local_658;
          local_d8 = local_4e0;
          if (local_650 != (int *)0x0) {
            local_dc = 0xffffffff;
            LOCK();
            local_e0 = *local_650;
            *local_650 = *local_650 + -1;
            UNLOCK();
            if (local_e0 == 1) {
              if (local_638 == (long *)0x0) {
                local_70 = local_658;
                if (local_658 != (void *)0x0) {
                  free(local_658);
                }
              }
              else {
                (**(code **)(*local_638 + 0x18))(local_638,local_658);
              }
            }
          }
          local_658 = (void *)0x0;
          local_648 = 0;
          local_640 = 0;
          local_62c = 0;
          local_628 = 0;
          local_624 = 0;
          local_620 = 0;
          local_650 = (int *)0x0;
          local_43c = local_548 * local_544 + 1;
          local_430 = &local_6a8;
          local_28c = *(int *)((long)local_520 + 0x2c);
          local_290 = (int)local_520[6];
          local_294 = *(undefined4 *)((long)local_520 + 0x34);
          local_2a0 = (void *)(*local_520 + local_520[8] * (long)local_43c * local_520[2]);
          local_2a8 = local_520[2];
          local_2ac = (undefined4)local_520[3];
          local_2b8 = (long *)local_520[4];
          local_288 = &local_6a8;
          local_6a0 = (int *)0x0;
          local_674 = 1;
          local_1e8 = (long)local_28c * (long)local_290 * local_2a8;
          local_668 = (local_1e8 + 0xfU & 0xfffffffffffffff0) / local_2a8;
          local_680 = (int)local_520[5] + -1;
          if ((int)local_520[5] == 4) {
            local_668 = (long)*(int *)((long)local_520 + 0x2c) * (long)(int)local_520[6];
          }
          local_1ec = 0x10;
          local_43d = 1;
          local_618 = 0;
          local_630 = 0;
          local_398 = &local_6a8;
          local_39c = local_554;
          local_610 = fVar1;
          local_6a8 = local_2a0;
          local_698 = local_2a8;
          local_690 = local_2ac;
          local_688 = local_2b8;
          local_67c = local_28c;
          local_678 = local_290;
          local_670 = local_294;
          fVar1 = sigmoid(0.0);
          local_4d0 = &local_6a8;
          local_f8 = local_4d0;
          if (local_6a0 != (int *)0x0) {
            local_fc = 0xffffffff;
            LOCK();
            local_100 = *local_6a0;
            *local_6a0 = *local_6a0 + -1;
            UNLOCK();
            if (local_100 == 1) {
              if (local_688 == (long *)0x0) {
                local_60 = local_6a8;
                if (local_6a8 != (void *)0x0) {
                  free(local_6a8);
                }
              }
              else {
                (**(code **)(*local_688 + 0x18))(local_688,local_6a8);
              }
            }
          }
          local_6a8 = (void *)0x0;
          local_698 = 0;
          local_690 = 0;
          local_67c = 0;
          local_678 = 0;
          local_674 = 0;
          local_670 = 0;
          local_6a0 = (int *)0x0;
          local_45c = local_548 * local_544 + 2;
          local_450 = &local_6f8;
          local_254 = *(int *)((long)local_520 + 0x2c);
          local_258 = (int)local_520[6];
          local_25c = *(undefined4 *)((long)local_520 + 0x34);
          local_268 = (void *)(*local_520 + local_520[8] * (long)local_45c * local_520[2]);
          local_270 = local_520[2];
          local_274 = (undefined4)local_520[3];
          local_280 = (long *)local_520[4];
          local_250 = &local_6f8;
          local_6f0 = (int *)0x0;
          local_6c4 = 1;
          local_1f8 = (long)local_254 * (long)local_258 * local_270;
          local_6b8 = (local_1f8 + 0xfU & 0xfffffffffffffff0) / local_270;
          local_6d0 = (int)local_520[5] + -1;
          if ((int)local_520[5] == 4) {
            local_6b8 = (long)*(int *)((long)local_520 + 0x2c) * (long)(int)local_520[6];
          }
          local_1fc = 0x10;
          local_45d = 1;
          local_668 = 0;
          local_680 = 0;
          local_3a8 = &local_6f8;
          local_3ac = local_554;
          local_65c = fVar1;
          local_6f8 = local_268;
          local_6e8 = local_270;
          local_6e0 = local_274;
          local_6d8 = local_280;
          local_6cc = local_254;
          local_6c8 = local_258;
          local_6c0 = local_25c;
          fVar1 = sigmoid(0.0);
          local_4c0 = &local_6f8;
          local_118 = local_4c0;
          if (local_6f0 != (int *)0x0) {
            local_11c = 0xffffffff;
            LOCK();
            local_120 = *local_6f0;
            *local_6f0 = *local_6f0 + -1;
            UNLOCK();
            if (local_120 == 1) {
              if (local_6d8 == (long *)0x0) {
                local_50 = local_6f8;
                if (local_6f8 != (void *)0x0) {
                  free(local_6f8);
                }
              }
              else {
                (**(code **)(*local_6d8 + 0x18))(local_6d8,local_6f8);
              }
            }
          }
          local_6f8 = (void *)0x0;
          local_6e8 = 0;
          local_6e0 = 0;
          local_6cc = 0;
          local_6c8 = 0;
          local_6c4 = 0;
          local_6c0 = 0;
          local_6f0 = (int *)0x0;
          local_47c = local_548 * local_544 + 3;
          local_470 = &local_748;
          local_21c = *(int *)((long)local_520 + 0x2c);
          local_220 = (int)local_520[6];
          local_224 = *(undefined4 *)((long)local_520 + 0x34);
          local_230 = (void *)(*local_520 + local_520[8] * (long)local_47c * local_520[2]);
          local_238 = local_520[2];
          local_23c = (undefined4)local_520[3];
          local_248 = (long *)local_520[4];
          local_218 = &local_748;
          local_740 = (int *)0x0;
          local_714 = 1;
          local_208 = (long)local_21c * (long)local_220 * local_238;
          local_708 = (local_208 + 0xfU & 0xfffffffffffffff0) / local_238;
          local_720 = (int)local_520[5] + -1;
          if ((int)local_520[5] == 4) {
            local_708 = (long)*(int *)((long)local_520 + 0x2c) * (long)(int)local_520[6];
          }
          local_20c = 0x10;
          local_47d = 1;
          local_6b8 = 0;
          local_6d0 = 0;
          local_3b8 = &local_748;
          local_3bc = local_554;
          local_6ac = fVar1;
          local_748 = local_230;
          local_738 = local_238;
          local_730 = local_23c;
          local_728 = local_248;
          local_71c = local_21c;
          local_718 = local_220;
          local_710 = local_224;
          fVar1 = sigmoid(0.0);
          local_4b0 = &local_748;
          local_138 = local_4b0;
          if (local_740 != (int *)0x0) {
            local_13c = 0xffffffff;
            LOCK();
            local_140 = *local_740;
            *local_740 = *local_740 + -1;
            UNLOCK();
            if (local_140 == 1) {
              if (local_728 == (long *)0x0) {
                local_40 = local_748;
                if (local_748 != (void *)0x0) {
                  free(local_748);
                }
              }
              else {
                (**(code **)(*local_728 + 0x18))(local_728,local_748);
              }
            }
          }
          local_748 = (void *)0x0;
          local_738 = 0;
          local_730 = 0;
          local_720 = 0;
          local_71c = 0;
          local_718 = 0;
          local_714 = 0;
          local_710 = 0;
          local_708 = 0;
          local_740 = (int *)0x0;
          local_6fc = fVar1;
          std::pow<float,int>(0.0,0x165861);
          std::pow<float,int>(0.0,0x16589a);
          Object::Object((Object *)0x16598b);
          std::vector<Object,_std::allocator<Object>_>::push_back
                    (in_stack_fffffffffffff750,in_stack_fffffffffffff748);
        }
      }
    }
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = feat_blob.c / num_anchors - 5;

    const int feat_offset = num_class + 5;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * feat_offset + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * feat_offset + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * feat_offset + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * feat_offset + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * feat_offset + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * feat_offset + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}